

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O3

void Dtc_ManComputeCuts(Gia_Man_t *p,Vec_Int_t **pvCutsXor,Vec_Int_t **pvCutsMaj,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  undefined8 uVar3;
  Vec_Int_t *vCuts;
  int *piVar4;
  Vec_Int_t *vCutsXor;
  Vec_Int_t *vCutsMaj;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar5;
  long lVar6;
  uint uVar7;
  char *__function;
  uint uVar8;
  int iVar9;
  int iVar10;
  size_t __size;
  char *__file;
  char *__assertion;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  double dVar15;
  int **local_60;
  
  vCuts = (Vec_Int_t *)malloc(0x10);
  vCuts->nCap = 1000;
  vCuts->nSize = 0;
  piVar4 = (int *)malloc(4000);
  vCuts->pArray = piVar4;
  uVar7 = p->nObjs;
  uVar14 = ~(p->vCos->nSize + p->vCis->nSize);
  iVar9 = uVar7 + uVar14;
  vCutsXor = (Vec_Int_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < (uVar7 + uVar14) - 1) {
    iVar10 = iVar9;
  }
  vCutsXor->nSize = 0;
  vCutsXor->nCap = iVar10;
  if (iVar10 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar10 * 4);
  }
  vCutsXor->pArray = piVar4;
  vCutsMaj = (Vec_Int_t *)malloc(0x10);
  vCutsMaj->nSize = 0;
  vCutsMaj->nCap = iVar10;
  if (iVar10 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar10 << 2);
  }
  vCutsMaj->pArray = piVar4;
  iVar9 = iVar9 * 0x1e;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar10 = iVar9;
  }
  p_00->nCap = iVar10;
  if (iVar10 == 0) {
    p_00->pArray = (int *)0x0;
    if ((int)uVar7 < 1) goto LAB_005e0423;
    __size = (ulong)uVar7 * 4;
LAB_005e03dd:
    piVar4 = (int *)malloc(__size);
LAB_005e03ea:
    local_60 = &p_00->pArray;
    *local_60 = piVar4;
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p_00->nCap = uVar7;
  }
  else {
    piVar4 = (int *)malloc((long)iVar10 << 2);
    p_00->pArray = piVar4;
    if (iVar10 < (int)uVar7) {
      __size = (long)(int)uVar7 << 2;
      if (piVar4 == (int *)0x0) goto LAB_005e03dd;
      piVar4 = (int *)realloc(piVar4,__size);
      goto LAB_005e03ea;
    }
  }
  if (0 < (int)uVar7) {
    memset(piVar4,0,(ulong)uVar7 * 4);
  }
LAB_005e0423:
  local_60 = &p_00->pArray;
  p_00->nSize = uVar7;
  Gia_ManCleanValue(p);
  pVVar5 = p->vCis;
  if (0 < pVVar5->nSize) {
    lVar12 = 0;
    do {
      iVar9 = pVVar5->pArray[lVar12];
      lVar6 = (long)iVar9;
      if ((lVar6 < 0) || (p->nObjs <= iVar9)) {
        __assertion = "v >= 0 && v < p->nObjs";
        __file = 
        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
        ;
        __function = "Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)";
        goto LAB_005e073f;
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (p_00->nSize <= iVar9) goto LAB_005e070b;
      pGVar1 = p->pObjs + lVar6;
      p_00->pArray[lVar6] = p_00->nSize;
      Vec_IntPush(p_00,1);
      Vec_IntPush(p_00,1);
      pGVar2 = p->pObjs;
      if ((pGVar1 < pGVar2) || (pGVar2 + p->nObjs <= pGVar1)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00,(int)((ulong)((long)pGVar1 - (long)pGVar2) >> 2) * -0x55555555);
      lVar12 = lVar12 + 1;
      pVVar5 = p->vCis;
    } while (lVar12 < pVVar5->nSize);
  }
  iVar9 = p->nObjs;
  if (iVar9 < 1) {
    uVar11 = 0;
  }
  else {
    uVar13 = 0;
    uVar11 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar3 = *(undefined8 *)(p->pObjs + uVar13);
      uVar7 = (uint)uVar3;
      if ((~uVar7 & 0x1fffffff) != 0 && -1 < (int)uVar7) {
        iVar9 = (int)uVar13;
        uVar7 = iVar9 - (uVar7 & 0x1fffffff);
        if ((int)uVar7 < 0) {
LAB_005e06ec:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar14 = p_00->nSize;
        if ((int)uVar14 <= (int)uVar7) goto LAB_005e06ec;
        piVar4 = *local_60;
        uVar7 = piVar4[uVar7];
        if (((long)(int)uVar7 < 0) || (uVar14 <= uVar7)) {
LAB_005e072a:
          __assertion = "i >= 0 && i < p->nSize";
          __file = 
          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
          ;
          __function = "int *Vec_IntEntryP(Vec_Int_t *, int)";
LAB_005e073f:
          __assert_fail(__assertion,__file,0x1af,__function);
        }
        uVar8 = iVar9 - ((uint)((ulong)uVar3 >> 0x20) & 0x1fffffff);
        if (((int)uVar8 < 0) || (uVar14 <= uVar8)) goto LAB_005e06ec;
        uVar8 = piVar4[uVar8];
        if (((long)(int)uVar8 < 0) || (uVar14 <= uVar8)) goto LAB_005e072a;
        Dtc_ManCutMerge(p,iVar9,piVar4 + (int)uVar7,piVar4 + (int)uVar8,vCuts,vCutsXor,vCutsMaj);
        if (uVar14 <= uVar13) {
LAB_005e070b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        piVar4[uVar13] = uVar14;
        iVar9 = vCuts->nSize;
        if ((long)iVar9 < 1) goto LAB_005e06ec;
        piVar4 = vCuts->pArray;
        lVar12 = 0;
        do {
          Vec_IntPush(p_00,piVar4[lVar12]);
          lVar12 = lVar12 + 1;
        } while (iVar9 != lVar12);
        uVar11 = (ulong)(uint)((int)uVar11 + *piVar4);
        iVar9 = p->nObjs;
      }
      uVar13 = uVar13 + 1;
    } while ((long)uVar13 < (long)iVar9);
  }
  if (fVerbose != 0) {
    uVar7 = iVar9 + ~(p->vCos->nSize + p->vCis->nSize);
    dVar15 = (double)(int)uVar7;
    printf("Nodes = %d.  Cuts = %d.  Cuts/Node = %.2f.  Ints/Node = %.2f.\n",
           (double)(int)uVar11 / dVar15,(double)p_00->nSize / dVar15,(ulong)uVar7,uVar11);
  }
  if (vCuts->pArray != (int *)0x0) {
    free(vCuts->pArray);
  }
  free(vCuts);
  if (*local_60 != (int *)0x0) {
    free(*local_60);
  }
  free(p_00);
  *pvCutsXor = vCutsXor;
  *pvCutsMaj = vCutsMaj;
  return;
}

Assistant:

void Dtc_ManComputeCuts( Gia_Man_t * p, Vec_Int_t ** pvCutsXor, Vec_Int_t ** pvCutsMaj, int fVerbose )
{
    Gia_Obj_t * pObj; 
    int * pList0, * pList1, i, nCuts = 0;
    Vec_Int_t * vTemp = Vec_IntAlloc( 1000 );
    Vec_Int_t * vCutsXor = Vec_IntAlloc( Gia_ManAndNum(p) );
    Vec_Int_t * vCutsMaj = Vec_IntAlloc( Gia_ManAndNum(p) );
    Vec_Int_t * vCuts = Vec_IntAlloc( 30 * Gia_ManAndNum(p) );
    Vec_IntFill( vCuts, Gia_ManObjNum(p), 0 );
    Gia_ManCleanValue( p );
    Gia_ManForEachCi( p, pObj, i )
    {
        Vec_IntWriteEntry( vCuts, Gia_ObjId(p, pObj), Vec_IntSize(vCuts) );
        Vec_IntPush( vCuts, 1 );
        Vec_IntPush( vCuts, 1 );
        Vec_IntPush( vCuts, Gia_ObjId(p, pObj) );
    }
    Gia_ManForEachAnd( p, pObj, i )
    {
        pList0 = Vec_IntEntryP( vCuts, Vec_IntEntry(vCuts, Gia_ObjFaninId0(pObj, i)) );
        pList1 = Vec_IntEntryP( vCuts, Vec_IntEntry(vCuts, Gia_ObjFaninId1(pObj, i)) );
        Dtc_ManCutMerge( p, i, pList0, pList1, vTemp, vCutsXor, vCutsMaj );
        Vec_IntWriteEntry( vCuts, i, Vec_IntSize(vCuts) );
        Vec_IntAppend( vCuts, vTemp );
        nCuts += Vec_IntEntry( vTemp, 0 );
    }
    if ( fVerbose )
        printf( "Nodes = %d.  Cuts = %d.  Cuts/Node = %.2f.  Ints/Node = %.2f.\n", 
            Gia_ManAndNum(p), nCuts, 1.0*nCuts/Gia_ManAndNum(p), 1.0*Vec_IntSize(vCuts)/Gia_ManAndNum(p) );
    Vec_IntFree( vTemp );
    Vec_IntFree( vCuts );
    *pvCutsXor = vCutsXor;
    *pvCutsMaj = vCutsMaj;
}